

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::fill_t<wchar_t>::operator=(fill_t<wchar_t> *this,basic_string_view<wchar_t> s)

{
  size_t sVar1;
  char *message;
  wchar_t *pwVar2;
  format_error *in_RDI;
  size_t i;
  size_t size;
  size_t local_38;
  basic_string_view<wchar_t> local_10;
  
  sVar1 = basic_string_view<wchar_t>::size(&local_10);
  if (4 < sVar1) {
    message = (char *)__cxa_allocate_exception(0x10);
    format_error::format_error(in_RDI,message);
    __cxa_throw(message,&format_error::typeinfo,format_error::~format_error);
  }
  for (local_38 = 0; local_38 < sVar1; local_38 = local_38 + 1) {
    pwVar2 = basic_string_view<wchar_t>::operator[](&local_10,local_38);
    *(wchar_t *)(&in_RDI->super_runtime_error + local_38 * 4) = *pwVar2;
  }
  in_RDI[1].super_runtime_error = SUB81(sVar1,0);
  return;
}

Assistant:

FMT_CONSTEXPR void operator=(basic_string_view<Char> s) {
    auto size = s.size();
    if (size > max_size) {
      FMT_THROW(format_error("invalid fill"));
      return;
    }
    for (size_t i = 0; i < size; ++i) data_[i] = s[i];
    size_ = static_cast<unsigned char>(size);
  }